

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::sink_it_
          (daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this,log_msg *msg)

{
  long lVar1;
  long lVar2;
  formatter *pfVar3;
  time_point tVar4;
  size_t in_RCX;
  void *__buf;
  filename_t filename;
  memory_buf_t formatted;
  filename_t local_178;
  long local_158;
  undefined1 local_150 [16];
  undefined8 local_140;
  undefined8 local_138;
  undefined1 local_130 [256];
  
  lVar1 = (msg->time).__d.__r;
  lVar2 = (this->rotation_tp_).__d.__r;
  if (lVar2 <= lVar1) {
    in_RCX = 0x112e0be826d694b3;
    local_158 = lVar1 / 1000000000;
    details::os::localtime((os *)local_150,&local_158);
    daily_filename_calculator::calc_filename(&local_178,&this->base_filename_,(tm *)local_150);
    details::file_helper::open(&this->file_helper_,(char *)&local_178,(uint)this->truncate_);
    tVar4 = next_rotation_tp_(this);
    (this->rotation_tp_).__d.__r = (rep)tVar4.__d.__r;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
  }
  local_140._0_4_ = 0;
  local_140._4_4_ = 0;
  local_150._0_8_ = &PTR_grow_00159480;
  local_138._0_4_ = 0xfa;
  local_138._4_4_ = 0;
  pfVar3 = (this->super_base_sink<std::mutex>).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_150._8_8_ = local_130;
  (*pfVar3->_vptr_formatter[2])(pfVar3,msg,local_150);
  details::file_helper::write(&this->file_helper_,(int)local_150,__buf,in_RCX);
  if ((lVar2 <= lVar1) && (this->max_files_ != 0)) {
    delete_old_(this);
  }
  if ((undefined1 *)local_150._8_8_ != local_130) {
    operator_delete((void *)local_150._8_8_);
  }
  return;
}

Assistant:

void sink_it_(const details::log_msg &msg) override
    {
        auto time = msg.time;
        bool should_rotate = time >= rotation_tp_;
        if (should_rotate)
        {
            auto filename = FileNameCalc::calc_filename(base_filename_, now_tm(time));
            file_helper_.open(filename, truncate_);
            rotation_tp_ = next_rotation_tp_();
        }
        memory_buf_t formatted;
        base_sink<Mutex>::formatter_->format(msg, formatted);
        file_helper_.write(formatted);

        // Do the cleaning only at the end because it might throw on failure.
        if (should_rotate && max_files_ > 0)
        {
            delete_old_();
        }
    }